

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cpp
# Opt level: O2

void __thiscall pfederc::BiOpExpr::~BiOpExpr(BiOpExpr *this)

{
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&this->rhs);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&this->lhs);
  return;
}

Assistant:

BiOpExpr::~BiOpExpr() {
}